

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image-write.h
# Opt level: O1

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  byte *pbVar1;
  void **arr;
  byte bVar2;
  undefined8 *puVar3;
  void *pvVar4;
  long lVar5;
  bool bVar6;
  undefined1 uVar7;
  int iVar8;
  uint uVar9;
  void *__ptr;
  void *pvVar10;
  uchar *puVar11;
  uchar *puVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  int itemsize;
  int iVar16;
  undefined8 extraout_RDX;
  undefined8 uVar17;
  undefined8 extraout_RDX_00;
  uint uVar18;
  int iVar19;
  int best_filter_val;
  int iVar20;
  uint itemsize_00;
  byte bVar21;
  undefined4 in_register_00000084;
  ulong uVar22;
  ulong uVar23;
  uint unaff_R12D;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  int in_stack_ffffffffffffff68;
  uint local_94;
  uchar *in_stack_ffffffffffffff70;
  uchar *puVar29;
  uint *puVar30;
  ulong local_80;
  
  uVar18 = x * 4;
  if (stride_bytes == 0) {
    stride_bytes = uVar18;
  }
  iVar20 = x * 4 + 1;
  uVar26 = iVar20 * y;
  __ptr = malloc((long)(int)uVar26);
  if (__ptr != (void *)0x0) {
    pvVar10 = malloc((long)(int)uVar18);
    if (pvVar10 == (void *)0x0) {
      free(__ptr);
    }
    else {
      if (0 < y) {
        uVar25 = 1;
        if (1 < (int)uVar18) {
          uVar25 = (ulong)uVar18;
        }
        local_80 = 0;
        do {
          iVar16 = 0x7fffffff;
          iVar24 = 0;
          iVar19 = 0;
          do {
            stbiw__encode_png_line
                      (pixels,stride_bytes,x,(int)local_80,iVar19,(int)pvVar10,
                       in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff70);
            if (x < 1) {
              iVar8 = 0;
            }
            else {
              uVar14 = 0;
              iVar8 = 0;
              do {
                bVar21 = (char)*(byte *)((long)pvVar10 + uVar14) >> 7;
                iVar8 = iVar8 + (uint)(byte)((*(byte *)((long)pvVar10 + uVar14) ^ bVar21) - bVar21);
                uVar14 = uVar14 + 1;
              } while (uVar25 != uVar14);
            }
            if (iVar8 < iVar16) {
              iVar16 = iVar8;
              iVar24 = iVar19;
            }
            iVar19 = iVar19 + 1;
          } while (iVar19 != 5);
          uVar7 = 5;
          if (iVar24 != 5) {
            stbiw__encode_png_line
                      (pixels,stride_bytes,x,(int)local_80,iVar24,(int)pvVar10,
                       in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff70);
            uVar7 = (undefined1)iVar24;
          }
          lVar15 = local_80 * (long)iVar20;
          *(undefined1 *)((long)__ptr + lVar15) = uVar7;
          memcpy((void *)((long)__ptr + lVar15 + 1),pvVar10,(long)(int)uVar18);
          local_80 = local_80 + 1;
          unaff_R12D = x;
        } while (local_80 != (uint)y);
      }
      free(pvVar10);
      puVar11 = (uchar *)0x0;
      local_94 = 0;
      puVar29 = (uchar *)0x0;
      pvVar10 = malloc(0x20000);
      if (pvVar10 != (void *)0x0) {
        stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,itemsize);
        iVar20 = *(int *)(puVar29 + -4);
        iVar16 = iVar20 + 1;
        *(int *)(puVar29 + -4) = iVar16;
        puVar29[iVar20] = 'x';
        if ((puVar29 == (uchar *)0x0) || (*(int *)(puVar29 + -8) <= *(int *)(puVar29 + -4) + 1)) {
          stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,iVar16);
        }
        iVar20 = *(int *)(puVar29 + -4);
        *(int *)(puVar29 + -4) = iVar20 + 1;
        puVar29[iVar20] = '^';
        local_94 = 1;
        iVar20 = 1;
        puVar11 = stbiw__zlib_flushf(puVar29,&local_94,(int *)&stack0xffffffffffffff68);
        local_94 = local_94 | 1 << ((byte)iVar20 & 0x1f);
        iVar20 = iVar20 + 2;
        puVar11 = stbiw__zlib_flushf(puVar11,&local_94,(int *)&stack0xffffffffffffff68);
        uVar18 = 0;
        memset(pvVar10,0,0x20000);
        if (3 < (int)uVar26) {
          uVar18 = 0;
          do {
            lVar15 = (long)(int)uVar18;
            uVar13 = (uint)CONCAT12(*(undefined1 *)((long)__ptr + lVar15 + 2),
                                    *(undefined2 *)((long)__ptr + lVar15));
            uVar13 = uVar13 * 8 ^ uVar13;
            uVar13 = (uVar13 >> 5) + uVar13;
            uVar13 = uVar13 * 0x10 ^ uVar13;
            uVar13 = (uVar13 >> 0x11) + uVar13;
            uVar25 = (ulong)((uVar13 >> 6) + uVar13 & 0x3fff);
            puVar3 = *(undefined8 **)((long)pvVar10 + uVar25 * 8);
            uVar14 = 0;
            if (puVar3 != (undefined8 *)0x0) {
              uVar14 = (ulong)*(uint *)((long)puVar3 + -4);
            }
            pbVar1 = (byte *)((long)__ptr + lVar15);
            if ((int)uVar14 < 1) {
              iVar16 = 3;
              lVar27 = 0;
            }
            else {
              uVar13 = (uVar26 - uVar18) - 1;
              if (0x100 < uVar13) {
                uVar13 = 0x101;
              }
              iVar16 = 3;
              uVar22 = 0;
              lVar27 = 0;
              do {
                lVar28 = puVar3[uVar22];
                if ((long)(int)(uVar18 - 0x8000) < lVar28 - (long)__ptr) {
                  uVar23 = 0;
                  if (0 < (int)(uVar26 - uVar18)) {
                    do {
                      if (*(byte *)(lVar28 + uVar23) != pbVar1[uVar23]) goto LAB_001391f2;
                      uVar23 = uVar23 + 1;
                    } while (uVar13 + 1 != uVar23);
                    uVar23 = (ulong)(uVar13 + 1);
                  }
LAB_001391f2:
                  iVar19 = (int)uVar23;
                  iVar24 = iVar16;
                  if (iVar16 < iVar19) {
                    iVar24 = iVar19;
                  }
                  bVar6 = iVar16 <= iVar19;
                  iVar16 = iVar24;
                  if (bVar6) {
                    lVar27 = lVar28;
                  }
                }
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar14);
            }
            arr = (void **)((long)pvVar10 + uVar25 * 8);
            if (puVar3 == (undefined8 *)0x0) {
LAB_00139254:
              stbiw__sbgrowf(arr,8,(int)pvVar10);
            }
            else {
              if (*(int *)((long)puVar3 + -4) == 0x10) {
                puVar3[6] = puVar3[0xe];
                puVar3[7] = puVar3[0xf];
                puVar3[4] = puVar3[0xc];
                puVar3[5] = puVar3[0xd];
                puVar3[2] = puVar3[10];
                puVar3[3] = puVar3[0xb];
                *puVar3 = puVar3[8];
                puVar3[1] = puVar3[9];
                *(undefined4 *)((long)puVar3 + -4) = 8;
              }
              if (*(int *)(puVar3 + -1) <= *(int *)((long)puVar3 + -4) + 1) goto LAB_00139254;
            }
            pvVar4 = *arr;
            iVar24 = *(int *)((long)pvVar4 + -4);
            *(int *)((long)pvVar4 + -4) = iVar24 + 1;
            *(byte **)((long)pvVar4 + (long)iVar24 * 8) = pbVar1;
            if (lVar27 == 0) {
              lVar28 = 0;
            }
            else {
              uVar13 = (uint)*(uint3 *)(pbVar1 + 1) * 8 ^ (uint)*(uint3 *)(pbVar1 + 1);
              uVar13 = (uVar13 >> 5) + uVar13;
              uVar13 = uVar13 * 0x10 ^ uVar13;
              uVar13 = (uVar13 >> 0x11) + uVar13;
              lVar5 = *(long *)((long)pvVar10 + (ulong)((uVar13 >> 6) + uVar13 & 0x3fff) * 8);
              if (lVar5 == 0) {
                uVar25 = 0;
              }
              else {
                uVar25 = (ulong)*(uint *)(lVar5 + -4);
              }
              lVar28 = lVar27;
              if (0 < (int)uVar25) {
                uVar13 = (uVar26 + ~uVar18) - 1;
                if (0x100 < uVar13) {
                  uVar13 = 0x101;
                }
                uVar14 = 0;
                do {
                  lVar28 = *(long *)(lVar5 + uVar14 * 8);
                  if ((long)(int)(uVar18 - 0x7fff) < lVar28 - (long)__ptr) {
                    uVar22 = 0;
                    iVar24 = 0;
                    if (0 < (int)(~uVar18 + uVar26)) {
                      do {
                        if (*(char *)(lVar28 + uVar22) !=
                            *(char *)((long)__ptr + uVar22 + lVar15 + 1)) goto LAB_00139345;
                        uVar22 = uVar22 + 1;
                      } while (uVar13 + 1 != uVar22);
                      uVar22 = (ulong)(uVar13 + 1);
LAB_00139345:
                      iVar24 = (int)uVar22;
                    }
                    lVar28 = 0;
                    if (iVar16 < iVar24) break;
                  }
                  uVar14 = uVar14 + 1;
                  lVar28 = lVar27;
                } while (uVar14 != uVar25);
              }
            }
            bVar21 = (byte)iVar20;
            if (lVar28 == 0) {
              bVar2 = *pbVar1;
              if (bVar2 < 0x90) {
                uVar13 = bVar2 + 0x30;
                iVar16 = 0;
                iVar24 = -8;
                do {
                  iVar16 = (uVar13 & 1) + iVar16 * 2;
                  uVar13 = uVar13 >> 1;
                  iVar24 = iVar24 + 1;
                } while (iVar24 != 0);
                uVar13 = iVar16 << (bVar21 & 0x1f);
                iVar20 = iVar20 + 8;
              }
              else {
                uVar13 = bVar2 | 0x100;
                iVar16 = 0;
                iVar24 = -9;
                do {
                  iVar16 = (uVar13 & 1) + iVar16 * 2;
                  uVar13 = uVar13 >> 1;
                  iVar24 = iVar24 + 1;
                } while (iVar24 != 0);
                uVar13 = iVar16 << (bVar21 & 0x1f);
                iVar20 = iVar20 + 9;
              }
              local_94 = local_94 | uVar13;
              iVar16 = 1;
LAB_00139554:
              puVar11 = stbiw__zlib_flushf(puVar11,&local_94,(int *)&stack0xffffffffffffff68);
            }
            else {
              iVar24 = (int)pbVar1 - (int)lVar28;
              if ((0x7fff < iVar24) || (0x102 < iVar16)) {
                __assert_fail("d <= 32767 && best <= 258",
                              "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image-write.h"
                              ,0x3bf,
                              "unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)")
                ;
              }
              uVar25 = 0;
              do {
                uVar14 = uVar25;
                uVar25 = uVar14 + 1;
              } while ((int)(uint)*(ushort *)(stbi_zlib_compress_lengthc + uVar14 * 2 + 2) <= iVar16
                      );
              if (uVar14 < 0x17) {
                iVar19 = 0;
                iVar8 = -7;
                do {
                  iVar19 = ((uint)uVar25 & 1) + iVar19 * 2;
                  uVar25 = (ulong)((uint)uVar25 >> 1);
                  iVar8 = iVar8 + 1;
                } while (iVar8 != 0);
                uVar13 = iVar19 << (bVar21 & 0x1f);
                iVar20 = iVar20 + 7;
              }
              else {
                uVar13 = (int)uVar25 + 0xa8;
                iVar19 = 0;
                iVar8 = -8;
                do {
                  iVar19 = (uVar13 & 1) + iVar19 * 2;
                  uVar13 = uVar13 >> 1;
                  iVar8 = iVar8 + 1;
                } while (iVar8 != 0);
                uVar13 = iVar19 << (bVar21 & 0x1f);
                iVar20 = iVar20 + 8;
              }
              local_94 = local_94 | uVar13;
              puVar11 = stbiw__zlib_flushf(puVar11,&local_94,(int *)&stack0xffffffffffffff68);
              uVar14 = uVar14 & 0xffffffff;
              if (0xffffffffffffffeb < uVar14 - 0x1c) {
                local_94 = local_94 |
                           iVar16 - (uint)*(ushort *)(stbi_zlib_compress_lengthc + uVar14 * 2) <<
                           ((byte)iVar20 & 0x1f);
                iVar20 = (uint)(byte)stbi_zlib_compress_lengtheb[uVar14] + iVar20;
                puVar11 = stbiw__zlib_flushf(puVar11,&local_94,(int *)&stack0xffffffffffffff68);
              }
              uVar25 = 0xffffffffffffffff;
              do {
                lVar15 = uVar25 * 2;
                uVar25 = uVar25 + 1;
              } while ((int)(uint)*(ushort *)(stbi_zlib_compress_distc + lVar15 + 4) <= iVar24);
              iVar19 = 0;
              iVar8 = -5;
              uVar14 = uVar25 & 0xffffffff;
              do {
                iVar19 = ((uint)uVar14 & 1) + iVar19 * 2;
                uVar14 = uVar14 >> 1;
                iVar8 = iVar8 + 1;
              } while (iVar8 != 0);
              local_94 = local_94 | iVar19 << ((byte)iVar20 & 0x1f);
              iVar20 = iVar20 + 5;
              puVar11 = stbiw__zlib_flushf(puVar11,&local_94,(int *)&stack0xffffffffffffff68);
              if (3 < uVar25) {
                local_94 = local_94 |
                           iVar24 - (uint)*(ushort *)
                                           (stbi_zlib_compress_distc + (uVar25 & 0xffffffff) * 2) <<
                           ((byte)iVar20 & 0x1f);
                iVar20 = (uint)(byte)stbi_zlib_compress_disteb[uVar25 & 0xffffffff] + iVar20;
                goto LAB_00139554;
              }
            }
            uVar18 = iVar16 + uVar18;
          } while ((int)uVar18 < (int)(uVar26 - 3));
        }
        if ((int)uVar18 < (int)uVar26) {
          lVar15 = (long)(int)uVar18;
          do {
            bVar21 = *(byte *)((long)__ptr + lVar15);
            if (bVar21 < 0x90) {
              uVar18 = bVar21 + 0x30;
              iVar16 = 0;
              iVar24 = -8;
              do {
                iVar16 = (uVar18 & 1) + iVar16 * 2;
                uVar18 = uVar18 >> 1;
                iVar24 = iVar24 + 1;
              } while (iVar24 != 0);
              uVar18 = iVar16 << ((byte)iVar20 & 0x1f);
              iVar20 = iVar20 + 8;
            }
            else {
              uVar18 = bVar21 | 0x100;
              iVar16 = 0;
              iVar24 = -9;
              do {
                iVar16 = (uVar18 & 1) + iVar16 * 2;
                uVar18 = uVar18 >> 1;
                iVar24 = iVar24 + 1;
              } while (iVar24 != 0);
              uVar18 = iVar16 << ((byte)iVar20 & 0x1f);
              iVar20 = iVar20 + 9;
            }
            local_94 = local_94 | uVar18;
            puVar11 = stbiw__zlib_flushf(puVar11,&local_94,(int *)&stack0xffffffffffffff68);
            lVar15 = lVar15 + 1;
          } while (uVar26 != (uint)lVar15);
        }
        iVar20 = iVar20 + 7;
        puVar11 = stbiw__zlib_flushf(puVar11,&local_94,(int *)&stack0xffffffffffffff68);
        if (iVar20 != 0) {
          do {
            iVar20 = iVar20 + 1;
            puVar11 = stbiw__zlib_flushf(puVar11,&local_94,(int *)&stack0xffffffffffffff68);
          } while (iVar20 != 0);
        }
        lVar15 = 0;
        puVar29 = puVar11;
        do {
          lVar27 = *(long *)((long)pvVar10 + lVar15 * 8);
          if (lVar27 != 0) {
            free((void *)(lVar27 + -8));
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x4000);
        free(pvVar10);
        uVar18 = (uint)extraout_RDX;
        iVar20 = (int)((ulong)((long)(int)(uVar26 + 0x7ffe) * -0x7ffefffd) >> 0x20) + uVar26 +
                 0x7ffe;
        if (((int)(((iVar20 >> 0xe) - (iVar20 >> 0x1f)) * 5 + uVar26 + 2) < *(int *)(puVar11 + -4))
           && (puVar11[-4] = '\x02', puVar11[-3] = '\0', puVar11[-2] = '\0', puVar11[-1] = '\0',
              0 < (int)uVar26)) {
          iVar20 = 0;
          uVar17 = extraout_RDX;
          do {
            uVar18 = uVar26 - iVar20;
            uVar13 = 0x7fff;
            if ((int)uVar18 < 0x7fff) {
              uVar13 = uVar18;
            }
            if ((puVar29 == (uchar *)0x0) ||
               (puVar11 = puVar29, *(int *)(puVar29 + -8) <= *(int *)(puVar29 + -4) + 1)) {
              stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,(int)uVar17);
              puVar11 = puVar29;
            }
            iVar16 = *(int *)(puVar11 + -4);
            iVar24 = iVar16 + 1;
            *(int *)(puVar11 + -4) = iVar24;
            puVar11[iVar16] = (int)uVar18 < 0x8000;
            if ((puVar11 == (uchar *)0x0) || (*(int *)(puVar11 + -8) <= *(int *)(puVar11 + -4) + 1))
            {
              stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,iVar24);
            }
            iVar16 = *(int *)(puVar11 + -4);
            iVar24 = iVar16 + 1;
            *(int *)(puVar11 + -4) = iVar24;
            puVar11[iVar16] = (uchar)uVar13;
            if ((puVar11 == (uchar *)0x0) || (*(int *)(puVar11 + -8) <= *(int *)(puVar11 + -4) + 1))
            {
              stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,iVar24);
            }
            iVar16 = *(int *)(puVar11 + -4);
            iVar24 = iVar16 + 1;
            *(int *)(puVar11 + -4) = iVar24;
            puVar11[iVar16] = (uchar)(uVar13 >> 8);
            if ((puVar11 == (uchar *)0x0) || (*(int *)(puVar11 + -8) <= *(int *)(puVar11 + -4) + 1))
            {
              stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,iVar24);
            }
            iVar16 = *(int *)(puVar11 + -4);
            iVar24 = iVar16 + 1;
            *(int *)(puVar11 + -4) = iVar24;
            puVar11[iVar16] = (uchar)~uVar13;
            if ((puVar11 == (uchar *)0x0) || (*(int *)(puVar11 + -8) <= *(int *)(puVar11 + -4) + 1))
            {
              stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,iVar24);
            }
            iVar16 = *(int *)(puVar11 + -4);
            *(int *)(puVar11 + -4) = iVar16 + 1;
            puVar11[iVar16] = (uchar)(~uVar13 >> 8);
            puVar29 = puVar11;
            memcpy(puVar11 + *(int *)(puVar11 + -4),(void *)((long)iVar20 + (long)__ptr),
                   (long)(int)uVar13);
            uVar18 = (uint)extraout_RDX_00;
            *(uint *)(puVar11 + -4) = *(int *)(puVar11 + -4) + uVar13;
            iVar20 = iVar20 + uVar13;
            uVar17 = extraout_RDX_00;
          } while (iVar20 < (int)uVar26);
        }
        if ((int)uVar26 < 1) {
          uVar13 = 0;
          itemsize_00 = 1;
        }
        else {
          uVar9 = uVar26 % 0x15b0;
          itemsize_00 = 1;
          uVar13 = 0;
          uVar25 = 0;
          do {
            if (uVar9 != 0) {
              uVar14 = 0;
              do {
                itemsize_00 = itemsize_00 + *(byte *)((long)__ptr + uVar14 + uVar25);
                uVar13 = uVar13 + itemsize_00;
                uVar14 = uVar14 + 1;
              } while (uVar9 != uVar14);
              itemsize_00 = itemsize_00 % 0xfff1;
              uVar13 = uVar13 % 0xfff1;
            }
            uVar18 = (int)uVar25 + uVar9;
            uVar25 = (ulong)uVar18;
            uVar9 = 0x15b0;
          } while ((int)uVar18 < (int)uVar26);
        }
        if ((puVar29 == (uchar *)0x0) || (*(int *)(puVar29 + -8) <= *(int *)(puVar29 + -4) + 1)) {
          stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,uVar18);
        }
        iVar20 = *(int *)(puVar29 + -4);
        iVar16 = iVar20 + 1;
        *(int *)(puVar29 + -4) = iVar16;
        puVar29[iVar20] = (uchar)(uVar13 >> 8);
        if ((puVar29 == (uchar *)0x0) || (*(int *)(puVar29 + -8) <= *(int *)(puVar29 + -4) + 1)) {
          stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,iVar16);
        }
        iVar20 = *(int *)(puVar29 + -4);
        iVar16 = iVar20 + 1;
        *(int *)(puVar29 + -4) = iVar16;
        puVar29[iVar20] = (uchar)uVar13;
        if ((puVar29 == (uchar *)0x0) || (*(int *)(puVar29 + -8) <= *(int *)(puVar29 + -4) + 1)) {
          stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,iVar16);
        }
        iVar20 = *(int *)(puVar29 + -4);
        *(int *)(puVar29 + -4) = iVar20 + 1;
        puVar29[iVar20] = (uchar)(itemsize_00 >> 8);
        if ((puVar29 == (uchar *)0x0) || (*(int *)(puVar29 + -8) <= *(int *)(puVar29 + -4) + 1)) {
          stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,itemsize_00);
        }
        iVar20 = *(int *)(puVar29 + -4);
        *(int *)(puVar29 + -4) = iVar20 + 1;
        puVar29[iVar20] = (uchar)itemsize_00;
        unaff_R12D = *(uint *)(puVar29 + -4);
        puVar11 = puVar29 + -8;
        memmove(puVar11,puVar29,(long)(int)unaff_R12D);
      }
      free(__ptr);
      if (puVar11 != (uchar *)0x0) {
        puVar29 = (uchar *)malloc((long)(int)(unaff_R12D + 0x39));
        if (puVar29 != (uchar *)0x0) {
          *(int *)CONCAT44(in_register_00000084,n) = unaff_R12D + 0x39;
          puVar29[0] = 0x89;
          puVar29[1] = 'P';
          puVar29[2] = 'N';
          puVar29[3] = 'G';
          puVar29[4] = '\r';
          puVar29[5] = '\n';
          puVar29[6] = '\x1a';
          puVar29[7] = '\n';
          puVar29[8] = '\0';
          puVar29[9] = '\0';
          puVar29[10] = '\0';
          puVar29[0xb] = '\r';
          puVar29[0xc] = 'I';
          puVar29[0xd] = 'H';
          puVar29[0xe] = 'D';
          puVar29[0xf] = 'R';
          puVar29[0x10] = (uchar)((uint)x >> 0x18);
          puVar29[0x11] = (uchar)((uint)x >> 0x10);
          puVar29[0x12] = (uchar)((uint)x >> 8);
          puVar29[0x13] = (uchar)x;
          puVar29[0x14] = (uchar)((uint)y >> 0x18);
          puVar29[0x15] = (uchar)((uint)y >> 0x10);
          puVar29[0x16] = (uchar)((uint)y >> 8);
          puVar29[0x17] = (uchar)y;
          puVar29[0x18] = '\b';
          puVar29[0x19] = '\x06';
          puVar29[0x1a] = '\0';
          puVar29[0x1b] = '\0';
          puVar30 = (uint *)(puVar29 + 0x1d);
          puVar29[0x1c] = '\0';
          stbiw__wpcrc((uchar **)&stack0xffffffffffffff70,0xd);
          *puVar30 = unaff_R12D >> 0x18 | (unaff_R12D & 0xff0000) >> 8 | (unaff_R12D & 0xff00) << 8
                     | unaff_R12D << 0x18;
          puVar30[1] = 0x54414449;
          memmove(puVar30 + 2,puVar11,(long)(int)unaff_R12D);
          puVar12 = (uchar *)((long)puVar30 + (long)(int)unaff_R12D + 8U);
          free(puVar11);
          stbiw__wpcrc((uchar **)&stack0xffffffffffffff70,unaff_R12D);
          puVar12[0] = '\0';
          puVar12[1] = '\0';
          puVar12[2] = '\0';
          puVar12[3] = '\0';
          puVar12[4] = 'I';
          puVar12[5] = 'E';
          puVar12[6] = 'N';
          puVar12[7] = 'D';
          puVar12 = puVar12 + 8;
          stbiw__wpcrc((uchar **)&stack0xffffffffffffff70,0);
          if (puVar12 == puVar29 + *(int *)CONCAT44(in_register_00000084,n)) {
            return puVar29;
          }
          __assert_fail("o == out + *out_len",
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image-write.h"
                        ,0x4b9,
                        "unsigned char *stbi_write_png_to_mem(const unsigned char *, int, int, int, int, int *)"
                       );
        }
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

STBIWDEF unsigned char *stbi_write_png_to_mem(const unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int force_filter = stbi_write_force_png_filter;
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int j,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   if (force_filter >= 5) {
      force_filter = -1;
   }

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      int filter_type;
      if (force_filter > -1) {
         filter_type = force_filter;
         stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, force_filter, line_buffer);
      } else { // Estimate the best filter by running through all of them:
         int best_filter = 0, best_filter_val = 0x7fffffff, est, i;
         for (filter_type = 0; filter_type < 5; filter_type++) {
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, filter_type, line_buffer);

            // Estimate the entropy of the line using this filter; the less, the better.
            est = 0;
            for (i = 0; i < x*n; ++i) {
               est += abs((signed char) line_buffer[i]);
            }
            if (est < best_filter_val) {
               best_filter_val = est;
               best_filter = filter_type;
            }
         }
         if (filter_type != best_filter) {  // If the last iteration already got us the best filter, don't redo it
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, best_filter, line_buffer);
            filter_type = best_filter;
         }
      }
      // when we get here, filter_type contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) filter_type;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, stbi_write_png_compression_level);
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = STBIW_UCHAR(ctype[n]);
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}